

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O2

void am_script_ok_proc(Am_Object *cmd)

{
  Am_Value *pAVar1;
  Am_Object undo_db;
  Am_Object script_window;
  Am_Object local_20;
  Am_Object window;
  Am_Object sel_widget;
  
  Am_Object::Get_Object(&undo_db,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&script_window,(Am_Slot_Flags)&undo_db);
  Am_Object::~Am_Object(&undo_db);
  pAVar1 = Am_Object::Get(&script_window,Am_UNDO_MENU_OF_COMMANDS,0);
  Am_Object::Am_Object(&undo_db,pAVar1);
  pAVar1 = Am_Object::Get(&undo_db,0x197,0);
  Am_Object::Am_Object(&sel_widget,pAVar1);
  pAVar1 = Am_Object::Get(&sel_widget,0x68,0);
  Am_Object::Am_Object(&window,pAVar1);
  finalize_script_execute_command(&script_window,&undo_db,&window,true);
  Am_Object::Am_Object(&local_20,&script_window);
  done_with_script_window(&local_20);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&window);
  Am_Object::~Am_Object(&sel_widget);
  Am_Object::~Am_Object(&undo_db);
  Am_Object::~Am_Object(&script_window);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_script_ok, (Am_Object cmd))
{
  Am_Object script_window = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object undo_db = script_window.Get(Am_UNDO_MENU_OF_COMMANDS);
  Am_Object sel_widget = undo_db.Get(Am_SELECTION_WIDGET);
  Am_Object window = sel_widget.Get(Am_WINDOW);
  finalize_script_execute_command(script_window, undo_db, window, true);
  done_with_script_window(script_window);
}